

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.h
# Opt level: O0

int use_auto_max_partition(AV1_COMP *cpi,BLOCK_SIZE sb_size,int mi_row,int mi_col)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  char in_SIL;
  long *in_RDI;
  AV1_COMMON *cm;
  bool local_21;
  
  iVar1 = frame_is_intra_only((AV1_COMMON *)(in_RDI + 0x77f0));
  local_21 = false;
  if ((((iVar1 == 0) && (local_21 = false, (int)in_RDI[0x13a5f] == 0)) &&
      (local_21 = false, *(char *)((long)in_RDI + 0x60969) != '\0')) &&
     (local_21 = false, in_SIL == '\x0f')) {
    iVar1 = is_full_sb((CommonModeInfoParams *)(in_RDI + 0x7831),in_EDX,in_ECX,BLOCK_128X128);
    local_21 = false;
    if ((iVar1 != 0) &&
       (local_21 = false, *(char *)(*in_RDI + 400 + (ulong)*(byte *)(in_RDI + 0xe258)) != '\x04')) {
      local_21 = *(char *)(*in_RDI + 400 + (ulong)*(byte *)(in_RDI + 0xe258)) != '\x05';
    }
  }
  return (int)local_21;
}

Assistant:

static inline int use_auto_max_partition(const AV1_COMP *const cpi,
                                         BLOCK_SIZE sb_size, int mi_row,
                                         int mi_col) {
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const AV1_COMMON *const cm = &cpi->common;
  return !frame_is_intra_only(cm) && !cpi->use_screen_content_tools &&
         cpi->sf.part_sf.auto_max_partition_based_on_simple_motion !=
             NOT_IN_USE &&
         sb_size == BLOCK_128X128 &&
         is_full_sb(&cm->mi_params, mi_row, mi_col, sb_size) &&
         cpi->ppi->gf_group.update_type[cpi->gf_frame_index] !=
             OVERLAY_UPDATE &&
         cpi->ppi->gf_group.update_type[cpi->gf_frame_index] !=
             INTNL_OVERLAY_UPDATE;
}